

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O0

void __thiscall flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,BrInstr *brInstr)

{
  bool bVar1;
  BasicBlock *pBVar2;
  BasicBlock *otherBB;
  BrInstr *brInstr_local;
  TargetCodeGenerator *this_local;
  
  pBVar2 = Instr::getBasicBlock((Instr *)brInstr);
  otherBB = BrInstr::targetBlock(brInstr);
  bVar1 = BasicBlock::isAfter(pBVar2,otherBB);
  if (!bVar1) {
    pBVar2 = BrInstr::targetBlock(brInstr);
    emitJump(this,pBVar2);
  }
  return;
}

Assistant:

void TargetCodeGenerator::visit(BrInstr& brInstr) {
  // Do not emit the JMP if the target block is emitted right after this block
  // (and thus, right after this instruction).
  if (brInstr.getBasicBlock()->isAfter(brInstr.targetBlock()))
    return;

  emitJump(brInstr.targetBlock());
}